

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void spy_param_test::fooHookLeave(void *targetFunc,void *callbackParam,size_t frameBase)

{
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int retval;
  RegRetBlock *regRetBlock;
  
  if (in_RDX == 0) {
    printf("~foo(func: %p, param: %p)\n",in_RDI,in_RSI);
  }
  else {
    printf("-foo(func: %p, param: %p) -> %d\n",in_RDI,in_RSI,*(ulong *)(in_RDX + -0xe0) & 0xffffffff
          );
  }
  return;
}

Assistant:

void
fooHookLeave(
	void* targetFunc,
	void* callbackParam,
	size_t frameBase
) {
	if (!frameBase) { // abandoned
		printf("~foo(func: %p, param: %p)\n", targetFunc, callbackParam);
		return;
	}

	spy::RegRetBlock* regRetBlock = (spy::RegRetBlock*)(frameBase + spy::FrameOffset_RegRetBlock);

#if (_AXL_CPU_AMD64)
	int retval = (int)regRetBlock->m_rax;
#elif (_AXL_CPU_X86)
	int retval = regRetBlock->m_eax;
#endif

	printf(
		"-foo(func: %p, param: %p) -> %d\n",
		targetFunc,
		callbackParam,
		retval
	);
}